

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::enumerateInstanceLayers
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *this;
  TestLog *log;
  TestStatus *pTVar1;
  qpTestResult qVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  char *__s;
  ulong uVar6;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> properties;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layerNames;
  ResultCollector results;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  Context *local_210;
  TestStatus *local_208;
  ResultCollector local_200;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  log = context->m_testCtx->m_log;
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"");
  tcu::ResultCollector::ResultCollector(&local_200,log,(string *)local_1b0);
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  local_210 = context;
  local_208 = __return_storage_ptr__;
  ::vk::enumerateInstanceLayerProperties(&local_240,context->m_platformInterface);
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_240.super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_240.super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this = (ostringstream *)(local_1b0 + 8);
    lVar5 = 0;
    uVar6 = 0;
    do {
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this);
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,": ",2);
      ::vk::operator<<((ostream *)this,
                       (VkLayerProperties *)
                       ((local_240.
                         super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                         ._M_impl.super__Vector_impl_data._M_start)->layerName + lVar5));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      std::ios_base::~ios_base(local_138);
      local_1b0._0_8_ = local_1b0 + 0x10;
      __s = (local_240.
             super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
             _M_impl.super__Vector_impl_data._M_start)->layerName + lVar5;
      if (__s == (char *)0x0) {
        pcVar4 = &DAT_00000001;
      }
      else {
        sVar3 = strlen(__s);
        pcVar4 = __s + sVar3;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,__s,pcVar4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x208;
    } while (uVar6 < (ulong)(((long)local_240.
                                    super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_240.
                                    super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0xfc0fc0fc0fc0fc1));
  }
  checkDuplicates(&local_200,"layer",&local_228);
  pTVar1 = local_208;
  local_1b0._8_8_ = 0;
  local_1b0._0_8_ = &PTR__CheckIncompleteResult_00d24f40;
  CheckIncompleteResult<vk::VkLayerProperties>::operator()
            ((CheckIncompleteResult<vk::VkLayerProperties> *)local_1b0,local_210,&local_200,
             (long)local_228.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_228.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  qVar2 = tcu::ResultCollector::getResult(&local_200);
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,local_200.m_message._M_dataplus._M_p,
             local_200.m_message._M_dataplus._M_p + local_200.m_message._M_string_length);
  pTVar1->m_code = qVar2;
  (pTVar1->m_description)._M_dataplus._M_p = (pointer)&(pTVar1->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar1->m_description,local_1b0._0_8_,
             (pointer)(local_1b0._0_8_ + local_1b0._8_8_));
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  if (local_240.super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.
                    super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_240.
                          super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.
                          super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_prefix._M_dataplus._M_p != &local_200.m_prefix.field_2) {
    operator_delete(local_200.m_prefix._M_dataplus._M_p,
                    local_200.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus enumerateInstanceLayers (Context& context)
{
	TestLog&						log					= context.getTestContext().getLog();
	tcu::ResultCollector			results				(log);
	const vector<VkLayerProperties>	properties			= enumerateInstanceLayerProperties(context.getPlatformInterface());
	vector<string>					layerNames;

	for (size_t ndx = 0; ndx < properties.size(); ndx++)
	{
		log << TestLog::Message << ndx << ": " << properties[ndx] << TestLog::EndMessage;

		layerNames.push_back(properties[ndx].layerName);
	}

	checkDuplicateLayers(results, layerNames);
	CheckEnumerateInstanceLayerPropertiesIncompleteResult()(context, results, layerNames.size());

	return tcu::TestStatus(results.getResult(), results.getMessage());
}